

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

optional<long> __thiscall context::find_label(context *this,string_view label)

{
  _Storage<long,_true> _Var1;
  _Storage<long,_true> extraout_RAX;
  _Storage<long,_true> _Var2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  optional<long> oVar4;
  key_type local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,label._M_str,label._M_str + label._M_len);
  _Var1 = (_Storage<long,_true>)
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->labels)._M_h,&local_38);
  _Var2 = _Var1;
  uVar3 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    _Var2 = extraout_RAX;
    uVar3 = extraout_RDX_00;
  }
  if ((__node_type *)_Var1._M_value == (__node_type *)0x0) {
    uVar3 = 0;
  }
  else {
    _Var2 = (_Storage<long,_true>)((_Storage<long,_true> *)(_Var1._M_value + 0x28))->_M_value;
    uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
  }
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar3;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = _Var2._M_value;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> context::find_label(std::string_view label) const
{
    const auto it = labels.find(std::string{label});
    if (it == std::end(labels)) {
        return {};
    }
    return it->second;
}